

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::metrics::MetricsTest_testReset_Test::TestBody(MetricsTest_testReset_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
  uVar2;
  __uniq_ptr_data<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>,_true,_true>
  _Var3;
  char cVar4;
  char *pcVar5;
  Message MVar6;
  bool bVar7;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int local_60;
  undefined4 uStack_5c;
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48 [8];
  string local_40;
  
  uVar2._M_t.
  super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
       (((this->super_MetricsTest)._metrics._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
         ._M_t.
         super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
         .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl)->
       _tracesStartedSampled)._M_t;
  (**(code **)(*(long *)uVar2._M_t.
                        super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                        .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                        _M_head_impl + 0x10))
            (uVar2._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,1);
  local_60 = 1;
  local_58 = *(long **)&(this->super_MetricsTest).field_0x30;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_40,"1","counters.size()",&local_60,(unsigned_long *)&local_58);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
               ,0x5c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_58 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    _Var3.
    super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
    ._M_t.
    super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
    .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>._M_head_impl =
         (((this->super_MetricsTest)._metrics._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl)->
         _reporterQueueLength)._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
    ;
    (**(code **)(*(long *)_Var3.
                          super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
                          .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>.
                          _M_head_impl + 0x10))
              (_Var3.
               super___uniq_ptr_impl<jaegertracing::metrics::Gauge,_std::default_delete<jaegertracing::metrics::Gauge>_>
               ._M_t.
               super__Tuple_impl<0UL,_jaegertracing::metrics::Gauge_*,_std::default_delete<jaegertracing::metrics::Gauge>_>
               .super__Head_base<0UL,_jaegertracing::metrics::Gauge_*,_false>._M_head_impl,1);
    local_60 = 1;
    local_58 = *(long **)&(this->super_MetricsTest).field_0x68;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_40,"1","gauges.size()",&local_60,(unsigned_long *)&local_58);
    if ((char)local_40._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_40._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                 ,0x60,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if (local_58 != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && (local_58 != (long *)0x0)) {
          (**(code **)(*local_58 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      paVar1 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"jaeger.test-timer","");
      StatsReporter::recordTimer
                ((StatsReporter *)&(this->super_MetricsTest)._metricsReporter,&local_40,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      local_60 = 1;
      local_58 = *(long **)&(this->super_MetricsTest).field_0xa0;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&local_40,"1","timers.size()",&local_60,(unsigned_long *)&local_58);
      if ((char)local_40._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_58);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                   ,0x66,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if (local_58 != (long *)0x0) {
          cVar4 = testing::internal::IsTrue(true);
          if ((cVar4 != '\0') && (local_58 != (long *)0x0)) {
            (**(code **)(*local_58 + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        jaegertracing::metrics::InMemoryStatsReporter::reset();
        MVar6 = (Message)(*(long *)&(this->super_MetricsTest).field_0x30 == 0);
        local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_58._0_1_ = MVar6;
        if ((bool)MVar6) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_58._0_1_ = (Message)(*(long *)&(this->super_MetricsTest).field_0x68 == 0);
          local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_58._0_1_) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_50,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            bVar7 = *(long *)&(this->super_MetricsTest).field_0xa0 == 0;
            local_58 = (long *)CONCAT71(local_58._1_7_,bVar7);
            local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!bVar7) {
              testing::Message::Message((Message *)&local_60);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&local_40,(char *)&local_58,"timers.empty()","false");
              testing::internal::AssertHelper::AssertHelper
                        (local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                         ,0x6b,local_40._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(local_48,(Message *)&local_60);
              testing::internal::AssertHelper::~AssertHelper(local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_40._M_dataplus._M_p != paVar1) {
                operator_delete(local_40._M_dataplus._M_p);
              }
              if (CONCAT44(uStack_5c,local_60) != 0) {
                cVar4 = testing::internal::IsTrue(true);
                if ((cVar4 != '\0') && ((long *)CONCAT44(uStack_5c,local_60) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(uStack_5c,local_60) + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_50,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::Message::Message((Message *)&local_60);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&local_40,(char *)&local_58,"gauges.empty()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                       ,0x6a,local_40._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(local_48,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != paVar1) {
              operator_delete(local_40._M_dataplus._M_p);
            }
            if (CONCAT44(uStack_5c,local_60) != 0) {
              cVar4 = testing::internal::IsTrue(true);
              if ((cVar4 != '\0') && ((long *)CONCAT44(uStack_5c,local_60) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(uStack_5c,local_60) + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_50,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
        else {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&local_40,(char *)&local_58,"counters.empty()","false");
          testing::internal::AssertHelper::AssertHelper
                    (local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                     ,0x69,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_48,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != paVar1) {
            operator_delete(local_40._M_dataplus._M_p);
          }
          if (CONCAT44(uStack_5c,local_60) != 0) {
            cVar4 = testing::internal::IsTrue(true);
            if ((cVar4 != '\0') && ((long *)CONCAT44(uStack_5c,local_60) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(uStack_5c,local_60) + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(MetricsTest, testReset)
{
    _metrics->tracesStartedSampled().inc(1);
    const auto& counters = _metricsReporter.counters();
    ASSERT_EQ(1, counters.size());

    _metrics->reporterQueueLength().update(1);
    const auto& gauges = _metricsReporter.gauges();
    ASSERT_EQ(1, gauges.size());

    constexpr auto time = static_cast<int64_t>(1);
    constexpr auto timerName = "jaeger.test-timer";
    _metricsReporter.recordTimer(timerName, time);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());

    _metricsReporter.reset();
    ASSERT_TRUE(counters.empty());
    ASSERT_TRUE(gauges.empty());
    ASSERT_TRUE(timers.empty());
}